

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Frame * __thiscall rw::Frame::removeChild(Frame *this)

{
  Frame *pFVar1;
  Frame *local_20;
  Frame *child;
  Frame *parent;
  Frame *this_local;
  
  pFVar1 = getParent(this);
  local_20 = pFVar1->child;
  if (local_20 == this) {
    pFVar1->child = this->next;
  }
  else {
    for (; local_20->next != this; local_20 = local_20->next) {
    }
    local_20->next = this->next;
  }
  this->next = (Frame *)0x0;
  (this->object).parent = (void *)0x0;
  setHierarchyRoot(this,this);
  updateObjects(this);
  return this;
}

Assistant:

Frame*
Frame::removeChild(void)
{
	Frame *parent = this->getParent();
	Frame *child = parent->child;
	if(child == this)
		parent->child = this->next;
	else{
		while(child->next != this)
			child = child->next;
		child->next = this->next;
	}
	this->object.parent = this->next = nil;
	// give the hierarchy a new root
	this->setHierarchyRoot(this);
	this->updateObjects();
	return this;
}